

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_decode.cc
# Opt level: O2

void anon_unknown.dwarf_240b::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," huffman_decode - Huffman decoding");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       huffman_decode [ options ] cbfile [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  cbfile:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       codebook                   (string)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       codeword sequence          (  bool)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       symbol sequence            (   int)");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " huffman_decode - Huffman decoding" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       huffman_decode [ options ] cbfile [ infile ] > stdout" << std::endl;  // NOLINT
  *stream << "  options:" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  cbfile:" << std::endl;
  *stream << "       codebook                   (string)" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       codeword sequence          (  bool)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       symbol sequence            (   int)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}